

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook_x86.c
# Opt level: O0

int funchook_write_jump32(funchook_t *funchook,uint8_t *src,uint8_t *dst,uint8_t *out)

{
  undefined1 *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  funchook_t *in_RDI;
  
  *in_RCX = 0xe9;
  *(int *)(in_RCX + 1) = (int)in_RDX - ((int)in_RSI + 5);
  funchook_log(in_RDI,"  Write jump32 0x%016lx -> 0x%016lx\n",in_RSI,in_RDX);
  return 0;
}

Assistant:

static int funchook_write_jump32(funchook_t *funchook, const uint8_t *src, const uint8_t *dst, uint8_t *out)
{
    out[0] = 0xe9;
    *(int*)(out + 1) = (int)(dst - (src + 5));
    funchook_log(funchook, "  Write jump32 0x"ADDR_FMT" -> 0x"ADDR_FMT"\n",
                 (size_t)src, (size_t)dst);
    return 0;
}